

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O1

char * SearchStdResConnTable(char *key)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  char cVar5;
  StdResConnTableEntry_t *pSVar6;
  bool bVar7;
  bool bVar8;
  
  cVar5 = *key;
  uVar3 = 0;
  if (cVar5 != '\0') {
    pcVar4 = key + 1;
    do {
      uVar1 = (int)uVar3 * 0x10 + (int)cVar5;
      uVar1 = uVar1 & 0xfffffff ^ uVar1 >> 0x18 & 0xfffffff0;
      uVar3 = (ulong)uVar1;
      cVar5 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar5 != '\0');
    uVar3 = (ulong)(uVar1 % 0xa39);
  }
  pSVar6 = StdResTblBucket[uVar3];
  bVar7 = pSVar6 == (StdResConnTableEntry_t *)0x0;
  if (bVar7) {
    bVar8 = false;
  }
  else {
    do {
      iVar2 = strcmp(key,pSVar6->key);
      if (iVar2 < 1) goto LAB_0012746c;
      pSVar6 = pSVar6->next;
      bVar7 = pSVar6 == (StdResConnTableEntry_t *)0x0;
    } while (!bVar7);
    iVar2 = 1;
LAB_0012746c:
    bVar8 = iVar2 != 0;
  }
  pcVar4 = (char *)0x0;
  if ((!bVar7) && (!bVar8)) {
    pcVar4 = pSVar6->value;
  }
  return pcVar4;
}

Assistant:

char *SearchStdResConnTable(char *key) {
   int r = 0;
   StdResConnTableEntry_t *t;

   t = StdResTblBucket[HashInStdResTbl(key)];

   while (t && (r = strcmp(key, t->key)) > 0) {
      t = t->next;
   }

   return (t ? (r ? NULL : t->value) : NULL);
}